

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa_common.h
# Opt level: O2

void init_alsa_device(int argc,char **argv,size_t default_period_size,size_t default_buffer_size,
                     int mode,snd_pcm_t **out_device,size_t *out_period_size,uint *out_rate,
                     snd_pcm_format_t *out_format)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  snd_pcm_format_t sVar4;
  ulong uVar5;
  char *__format;
  FILE *__stream;
  char *pcVar6;
  ulong uVar7;
  undefined8 uStack_80;
  snd_pcm_t *device;
  void *params;
  snd_pcm_format_t local_64;
  size_t period_size;
  size_t buffer_size;
  int local_4c;
  ulong local_48;
  char *local_40;
  snd_pcm_t **local_38;
  
  uVar5 = (ulong)argc;
  uVar7 = 1;
  local_48 = 48000;
  local_40 = "default";
  local_64 = SND_PCM_FORMAT_FLOAT;
  period_size = default_period_size;
  buffer_size = default_buffer_size;
  local_4c = mode;
  local_38 = out_device;
  do {
    if ((uVar5 <= uVar7) ||
       (((pcVar6 = argv[uVar7], *pcVar6 == '-' && (pcVar6[1] == '-')) && (pcVar6[2] == '\0'))))
    break;
    iVar1 = strcmp(pcVar6,"--device");
    if (iVar1 == 0) {
      if (uVar7 + 1 != uVar5) {
        local_40 = argv[uVar7 + 1];
        goto LAB_001026b2;
      }
LAB_00102a50:
      pcVar3 = *argv;
      __format = "%s: expected argument after %s\n";
LAB_00102a64:
      fprintf(_stderr,__format,pcVar3,pcVar6);
      goto LAB_00102a71;
    }
    iVar1 = strcmp(pcVar6,"--buffer-size");
    if (iVar1 == 0) {
      if (uVar7 + 1 != uVar5) {
        buffer_size = strtol(argv[uVar7 + 1],(char **)0x0,0);
        goto LAB_001026b2;
      }
      goto LAB_00102a50;
    }
    iVar1 = strcmp(pcVar6,"--period-size");
    if (iVar1 == 0) {
      if (uVar7 + 1 != uVar5) {
        period_size = strtol(argv[uVar7 + 1],(char **)0x0,0);
        goto LAB_001026b2;
      }
      goto LAB_00102a50;
    }
    iVar1 = strcmp(pcVar6,"--rate");
    if (iVar1 == 0) {
      if (uVar7 + 1 != uVar5) {
        local_48 = strtol(argv[uVar7 + 1],(char **)0x0,0);
        goto LAB_001026b2;
      }
      goto LAB_00102a50;
    }
    iVar1 = strcmp(pcVar6,"--format");
    if (iVar1 != 0) break;
    if (uVar7 + 1 == uVar5) goto LAB_00102a50;
    pcVar6 = argv[uVar7 + 1];
    iVar1 = strcmp(pcVar6,"float");
    if (iVar1 != 0) {
      iVar1 = strcmp(pcVar6,"s16");
      if (iVar1 == 0) {
        local_64 = SND_PCM_FORMAT_S16;
        goto LAB_001026b2;
      }
      iVar1 = strcmp(pcVar6,"s32");
      local_64 = SND_PCM_FORMAT_S32;
      if (iVar1 == 0) goto LAB_001026b2;
      pcVar3 = *argv;
      __format = "%s: unknown format %s\n";
      goto LAB_00102a64;
    }
    local_64 = SND_PCM_FORMAT_FLOAT;
LAB_001026b2:
    uVar7 = uVar7 + 2;
  } while( true );
  pcVar6 = local_40;
  iVar1 = snd_pcm_open(&device,local_40,0,local_4c);
  if ((iVar1 < 0) && (iVar1 = snd_pcm_recover(device,iVar1,0), __stream = _stderr, iVar1 < 0)) {
    uVar2 = snd_strerror(iVar1);
    uStack_80 = 0x7e;
  }
  else {
    iVar1 = snd_pcm_hw_params_malloc(&params);
    uVar7 = local_48;
    sVar4 = local_64;
    if ((iVar1 < 0) && (iVar1 = snd_pcm_recover(device,iVar1,0), __stream = _stderr, iVar1 < 0)) {
      uVar2 = snd_strerror(iVar1);
      uStack_80 = 0x7f;
    }
    else {
      iVar1 = snd_pcm_hw_params_any(device,params);
      if ((iVar1 < 0) && (iVar1 = snd_pcm_recover(device,iVar1,0), __stream = _stderr, iVar1 < 0)) {
        uVar2 = snd_strerror(iVar1);
        uStack_80 = 0x80;
      }
      else {
        iVar1 = snd_pcm_hw_params_set_access(device,params,3);
        if ((iVar1 < 0) && (iVar1 = snd_pcm_recover(device,iVar1,0), __stream = _stderr, iVar1 < 0))
        {
          uVar2 = snd_strerror(iVar1);
          uStack_80 = 0x81;
        }
        else {
          iVar1 = snd_pcm_hw_params_set_format(device,params,sVar4);
          if (iVar1 < 0) {
            sVar4 = SND_PCM_FORMAT_FLOAT;
            iVar1 = snd_pcm_hw_params_set_format(device,params,0xe);
            if (iVar1 < 0) {
              sVar4 = SND_PCM_FORMAT_S32;
              iVar1 = snd_pcm_hw_params_set_format(device,params,10);
              if (iVar1 < 0) {
                sVar4 = SND_PCM_FORMAT_S16;
                iVar1 = snd_pcm_hw_params_set_format(device,params,2);
                if ((iVar1 < 0) &&
                   (iVar1 = snd_pcm_recover(device,iVar1,0), __stream = _stderr, iVar1 < 0)) {
                  uVar2 = snd_strerror(iVar1);
                  uStack_80 = 0x86;
                  goto LAB_00102cb7;
                }
              }
            }
          }
          iVar1 = snd_pcm_hw_params_set_rate(device,params,uVar7 & 0xffffffff,0);
          if (iVar1 < 0) {
            uVar7 = 48000;
            iVar1 = snd_pcm_hw_params_set_rate(device,params,48000,0);
            if (iVar1 < 0) {
              uVar7 = 0xac44;
              iVar1 = snd_pcm_hw_params_set_rate(device,params,0xac44,0);
              if ((iVar1 < 0) &&
                 (iVar1 = snd_pcm_recover(device,iVar1,0), __stream = _stderr, iVar1 < 0)) {
                uVar2 = snd_strerror(iVar1);
                uStack_80 = 0x8b;
                goto LAB_00102cb7;
              }
            }
          }
          iVar1 = snd_pcm_hw_params_set_channels(device,params,2);
          if ((iVar1 < 0) &&
             (iVar1 = snd_pcm_recover(device,iVar1,0), __stream = _stderr, iVar1 < 0)) {
            uVar2 = snd_strerror(iVar1);
            uStack_80 = 0x8e;
          }
          else {
            iVar1 = snd_pcm_hw_params_set_buffer_size_near(device,params,&buffer_size);
            if ((iVar1 < 0) &&
               (iVar1 = snd_pcm_recover(device,iVar1,0), __stream = _stderr, iVar1 < 0)) {
              uVar2 = snd_strerror(iVar1);
              uStack_80 = 0x90;
            }
            else {
              iVar1 = snd_pcm_hw_params_set_period_size_near(device,params,&period_size,0);
              if ((iVar1 < 0) &&
                 (iVar1 = snd_pcm_recover(device,iVar1,0), __stream = _stderr, iVar1 < 0)) {
                uVar2 = snd_strerror(iVar1);
                uStack_80 = 0x91;
              }
              else {
                iVar1 = snd_pcm_hw_params(device,params);
                if ((iVar1 < 0) &&
                   (iVar1 = snd_pcm_recover(device,iVar1,0), __stream = _stderr, iVar1 < 0)) {
                  uVar2 = snd_strerror(iVar1);
                  uStack_80 = 0x92;
                }
                else {
                  snd_pcm_hw_params_free(params);
                  iVar1 = snd_pcm_sw_params_malloc(&params);
                  if ((iVar1 < 0) &&
                     (iVar1 = snd_pcm_recover(device,iVar1,0), __stream = _stderr, iVar1 < 0)) {
                    uVar2 = snd_strerror(iVar1);
                    uStack_80 = 0x95;
                  }
                  else {
                    iVar1 = snd_pcm_sw_params_current(device,params);
                    if ((iVar1 < 0) &&
                       (iVar1 = snd_pcm_recover(device,iVar1,0), __stream = _stderr, iVar1 < 0)) {
                      uVar2 = snd_strerror(iVar1);
                      uStack_80 = 0x96;
                    }
                    else {
                      iVar1 = snd_pcm_sw_params_set_start_threshold
                                        (device,params,buffer_size - period_size);
                      if ((iVar1 < 0) &&
                         (iVar1 = snd_pcm_recover(device,iVar1,0), __stream = _stderr, iVar1 < 0)) {
                        uVar2 = snd_strerror(iVar1);
                        uStack_80 = 0x97;
                      }
                      else {
                        iVar1 = snd_pcm_sw_params_set_avail_min(device,params,period_size);
                        if ((iVar1 < 0) &&
                           (iVar1 = snd_pcm_recover(device,iVar1,0), __stream = _stderr, iVar1 < 0))
                        {
                          uVar2 = snd_strerror(iVar1);
                          uStack_80 = 0x98;
                        }
                        else {
                          iVar1 = snd_pcm_sw_params(device,params);
                          if ((-1 < iVar1) ||
                             (iVar1 = snd_pcm_recover(device,iVar1,0), __stream = _stderr,
                             -1 < iVar1)) {
                            snd_pcm_sw_params_free(params);
                            pcVar3 = "s16";
                            if (sVar4 == SND_PCM_FORMAT_S32) {
                              pcVar3 = "s32";
                            }
                            if (sVar4 == SND_PCM_FORMAT_FLOAT) {
                              pcVar3 = "float";
                            }
                            printf("Opened ALSA device: %s, %s, %i Hz, %lu/%lu\n",pcVar6,pcVar3,
                                   uVar7 & 0xffffffff,period_size,buffer_size);
                            *local_38 = device;
                            *out_period_size = period_size;
                            *out_rate = (uint)uVar7;
                            *out_format = sVar4;
                            return;
                          }
                          uVar2 = snd_strerror(iVar1);
                          uStack_80 = 0x99;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00102cb7:
  fprintf(__stream,"%s(%i) ALSA internal error : %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/alsa_common.h"
          ,uStack_80,uVar2);
LAB_00102a71:
  fflush(_stderr);
  exit(1);
}

Assistant:

void init_alsa_device(int argc, char** argv,
                      size_t default_period_size,
                      size_t default_buffer_size,
                      int mode,
                      snd_pcm_t** out_device,
		      size_t* out_period_size,
		      unsigned int* out_rate,
                      snd_pcm_format_t* out_format) {
	snd_pcm_t* device;
	void* params;
	char* devicename = "default";
	size_t buffer_size = default_buffer_size;
	size_t period_size = default_period_size;
	const unsigned int channels = 2;
	unsigned int rate = 48000;
	snd_pcm_format_t format = SND_PCM_FORMAT_FLOAT;

	for(size_t i = 1; i < argc; ++i) {
		if(!strcmp(argv[i], "--")) {
			break;
		}

		if(!strcmp(argv[i], "--device")) {
			if(argc == i+1) FATAL("%s: expected argument after %s\n", argv[0], argv[i]);
			devicename = argv[i+1];
			++i;
			continue;
		}

		if(!strcmp(argv[i], "--buffer-size")) {
			if(argc == i+1) FATAL("%s: expected argument after %s\n", argv[0], argv[i]);
			buffer_size = (size_t)strtol(argv[i+1], NULL, 0);
			++i;
			continue;
		}

		if(!strcmp(argv[i], "--period-size")) {
			if(argc == i+1) FATAL("%s: expected argument after %s\n", argv[0], argv[i]);
			period_size = (size_t)strtol(argv[i+1], NULL, 0);
			++i;
			continue;
		}

		if(!strcmp(argv[i], "--rate")) {
			if(argc == i+1) FATAL("%s: expected argument after %s\n", argv[0], argv[i]);
			rate = (unsigned int)strtol(argv[i+1], NULL, 0);
			++i;
			continue;
		}

		if(!strcmp(argv[i], "--format")) {
			if(argc == i+1) FATAL("%s: expected argument after %s\n", argv[0], argv[i]);
			++i;

			if(!strcmp(argv[i], "float")) {
				format = SND_PCM_FORMAT_FLOAT;
				continue;
			}

			if(!strcmp(argv[i], "s16")) {
				format = SND_PCM_FORMAT_S16;
				continue;
			}

			if(!strcmp(argv[i], "s32")) {
				format = SND_PCM_FORMAT_S32;
				continue;
			}

			FATAL("%s: unknown format %s\n", argv[0], argv[i]);
		}

		break;
	}

	CHECK_ALSA_CALL(snd_pcm_open(&device, devicename, SND_PCM_STREAM_PLAYBACK, mode));
	CHECK_ALSA_CALL(snd_pcm_hw_params_malloc((snd_pcm_hw_params_t**)(&params)));
	CHECK_ALSA_CALL(snd_pcm_hw_params_any(device, params));
	CHECK_ALSA_CALL(snd_pcm_hw_params_set_access(device, params, SND_PCM_ACCESS_RW_INTERLEAVED));

	if(snd_pcm_hw_params_set_format(device, params, format) < 0
	   && snd_pcm_hw_params_set_format(device, params, format = SND_PCM_FORMAT_FLOAT) < 0
	   && snd_pcm_hw_params_set_format(device, params, format = SND_PCM_FORMAT_S32) < 0) {
		CHECK_ALSA_CALL(snd_pcm_hw_params_set_format(device, params, format = SND_PCM_FORMAT_S16));
	}

	if(snd_pcm_hw_params_set_rate(device, params, rate, 0) < 0
	   && snd_pcm_hw_params_set_rate(device, params, rate = 48000, 0) < 0) {
		CHECK_ALSA_CALL(snd_pcm_hw_params_set_rate(device, params, rate = 44100, 0));
	}

	CHECK_ALSA_CALL(snd_pcm_hw_params_set_channels(device, params, channels));

	CHECK_ALSA_CALL(snd_pcm_hw_params_set_buffer_size_near(device, params, &buffer_size));
	CHECK_ALSA_CALL(snd_pcm_hw_params_set_period_size_near(device, params, &period_size, 0));
	CHECK_ALSA_CALL(snd_pcm_hw_params(device, params));
	snd_pcm_hw_params_free(params);

	CHECK_ALSA_CALL(snd_pcm_sw_params_malloc((snd_pcm_sw_params_t**)(&params)));
	CHECK_ALSA_CALL(snd_pcm_sw_params_current(device, params));
	CHECK_ALSA_CALL(snd_pcm_sw_params_set_start_threshold(device, params, buffer_size - period_size));
	CHECK_ALSA_CALL(snd_pcm_sw_params_set_avail_min(device, params, period_size));
	CHECK_ALSA_CALL(snd_pcm_sw_params(device, params));
	snd_pcm_sw_params_free(params);

	printf("Opened ALSA device: %s, %s, %i Hz, %lu/%lu\n",
	       devicename,
	       format == SND_PCM_FORMAT_FLOAT ? "float" : (format == SND_PCM_FORMAT_S32 ? "s32" : "s16"),
	       rate,
	       period_size,
	       buffer_size
		);

	*out_device = device;
	*out_period_size = period_size;
	*out_rate = rate;
	*out_format = format;
}